

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::add2ndGenerationSamplingImaging
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  bool bVar1;
  bool local_dc;
  bool local_da;
  undefined1 local_c8 [8];
  TString textureTypeName;
  undefined1 local_88 [8];
  TString typeName;
  ulong uStack_58;
  TSampler sampler;
  size_t bType;
  int dim;
  int arrayed;
  int ms;
  int shadow;
  int image;
  bool skipCubeArrayed;
  bool skipBuffer;
  TBasicType bTypes [4];
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TBuiltIns *this_local;
  
  _image = 0x800000001;
  bTypes[0] = EbtUint;
  bTypes[1] = EbtFloat16;
  if ((profile != EEsProfile) || (local_da = true, 0x135 < version)) {
    local_da = profile != EEsProfile && version < 0x8c;
  }
  if ((profile != EEsProfile) || (local_dc = true, 0x135 < version)) {
    local_dc = profile != EEsProfile && version < 0x82;
  }
  for (ms = 0; ms < 2; ms = ms + 1) {
    for (arrayed = 0; arrayed < 2; arrayed = arrayed + 1) {
      for (dim = 0; dim < 2; dim = dim + 1) {
        if ((((((dim == 0) && (ms == 0)) || (arrayed == 0)) &&
             (((dim == 0 || (profile == EEsProfile)) || (0x8b < version)))) &&
            (((dim == 0 || (ms == 0)) || (profile != EEsProfile)))) &&
           (((dim == 0 || (profile != EEsProfile)) || (0x135 < version)))) {
          for (bType._4_4_ = 0; bType._4_4_ < 2; bType._4_4_ = bType._4_4_ + 1) {
            for (bType._0_4_ = Esd1D; (int)(TSamplerDim)bType < 9;
                bType._0_4_ = (TSamplerDim)bType + Esd1D) {
              if ((((((TSamplerDim)bType != EsdAttachmentEXT) &&
                    (((TSamplerDim)bType != EsdSubpass || (spvVersion->vulkan != 0)))) &&
                   (((TSamplerDim)bType != EsdSubpass ||
                    (((ms == 0 && (arrayed == 0)) && (bType._4_4_ == 0)))))) &&
                  (((((((TSamplerDim)bType != Esd1D && ((TSamplerDim)bType != EsdRect)) ||
                      (profile != EEsProfile)) &&
                     (((TSamplerDim)bType != EsdSubpass || (spvVersion->vulkan != 0)))) &&
                    (((TSamplerDim)bType != EsdSubpass ||
                     (((ms == 0 && (arrayed == 0)) && (bType._4_4_ == 0)))))) &&
                   (((((TSamplerDim)bType != Esd1D && ((TSamplerDim)bType != EsdRect)) ||
                     (profile != EEsProfile)) &&
                    ((((TSamplerDim)bType == Esd2D || ((TSamplerDim)bType == EsdSubpass)) ||
                     (dim == 0)))))))) &&
                 (((((((TSamplerDim)bType != EsdBuffer || (!local_da)) &&
                     (((TSamplerDim)bType != EsdBuffer ||
                      (((arrayed == 0 && (bType._4_4_ == 0)) && (dim == 0)))))) &&
                    ((((dim == 0 || (bType._4_4_ == 0)) || (profile != EEsProfile)) ||
                     (0x135 < version)))) && (((TSamplerDim)bType != Esd3D || (arrayed == 0)))) &&
                  ((((TSamplerDim)bType != EsdCube || ((bType._4_4_ == 0 || (!local_dc)))) &&
                   ((((TSamplerDim)bType != Esd3D && ((TSamplerDim)bType != EsdRect)) ||
                    (bType._4_4_ == 0)))))))) {
                for (uStack_58 = 0; uStack_58 < 4; uStack_58 = uStack_58 + 1) {
                  if (((((&image)[uStack_58] != 3) || ((profile != EEsProfile && (0x1c1 < version)))
                       ) && (((TSamplerDim)bType != EsdRect ||
                             ((0x8b < version || (uStack_58 == 0)))))) &&
                     ((arrayed == 0 || (((&image)[uStack_58] != 8 && ((&image)[uStack_58] != 9))))))
                  {
                    if ((TSamplerDim)bType == EsdSubpass) {
                      TSampler::setSubpass
                                ((TSampler *)((long)&typeName.field_2 + 0xc),(&image)[uStack_58],
                                 (bool)(-(dim != 0) & 1));
                    }
                    else if ((TSamplerDim)bType == EsdAttachmentEXT) {
                      TSampler::setAttachmentEXT
                                ((TSampler *)((long)&typeName.field_2 + 0xc),(&image)[uStack_58]);
                    }
                    else if (ms == 0) {
                      TSampler::set((TSampler *)((long)&typeName.field_2 + 0xc),(&image)[uStack_58],
                                    (TSamplerDim)bType,(bool)(-(bType._4_4_ != 0) & 1),
                                    (bool)(-(arrayed != 0) & 1),(bool)(-(dim != 0) & 1));
                    }
                    else {
                      TSampler::setImage((TSampler *)((long)&typeName.field_2 + 0xc),
                                         (&image)[uStack_58],(TSamplerDim)bType,
                                         (bool)(-(bType._4_4_ != 0) & 1),(bool)(-(arrayed != 0) & 1)
                                         ,(bool)(-(dim != 0) & 1));
                    }
                    TSampler::getString_abi_cxx11_
                              ((TString *)local_88,(TSampler *)((long)&typeName.field_2 + 0xc));
                    if ((TSamplerDim)bType == EsdSubpass) {
                      addSubpassSampling(this,(TSampler)typeName.field_2._12_4_,(TString *)local_88,
                                         version,profile);
                    }
                    else {
                      addQueryFunctions(this,(TSampler)typeName.field_2._12_4_,(TString *)local_88,
                                        version,profile);
                      if (ms == 0) {
                        textureTypeName.field_2._12_4_ = typeName.field_2._12_4_;
                        addSamplingFunctions
                                  (this,(TSampler)typeName.field_2._12_4_,(TString *)local_88,
                                   version,profile);
                        textureTypeName.field_2._8_4_ = typeName.field_2._12_4_;
                        addGatherFunctions(this,(TSampler)typeName.field_2._12_4_,
                                           (TString *)local_88,version,profile);
                        if (((0 < spvVersion->vulkan) &&
                            (bVar1 = TSampler::isCombined
                                               ((TSampler *)((long)&typeName.field_2 + 0xc)), bVar1)
                            ) && (((uint)typeName.field_2._12_4_ >> 0x11 & 1) == 0)) {
                          TSampler::setTexture
                                    ((TSampler *)((long)&typeName.field_2 + 0xc),
                                     typeName.field_2._12_4_ & 0xff,
                                     (uint)typeName.field_2._12_4_ >> 8 & 0xff,
                                     (bool)((byte)((uint)typeName.field_2._12_4_ >> 0x10) & 1),
                                     (bool)((byte)((uint)typeName.field_2._12_4_ >> 0x11) & 1),
                                     (bool)((byte)((uint)typeName.field_2._12_4_ >> 0x12) & 1));
                          TSampler::getString_abi_cxx11_
                                    ((TString *)local_c8,(TSampler *)((long)&typeName.field_2 + 0xc)
                                    );
                          addSamplingFunctions
                                    (this,(TSampler)typeName.field_2._12_4_,(TString *)local_c8,
                                     version,profile);
                          addQueryFunctions(this,(TSampler)typeName.field_2._12_4_,
                                            (TString *)local_c8,version,profile);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           *)local_c8);
                        }
                      }
                      else {
                        addImageFunctions(this,(TSampler)typeName.field_2._12_4_,(TString *)local_88
                                          ,version,profile);
                      }
                    }
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)local_88);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((profile != EEsProfile) && (0x1c1 < version)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,
               "bool sparseTexelsResidentARB(int code);\n");
  }
  return;
}

Assistant:

void TBuiltIns::add2ndGenerationSamplingImaging(int version, EProfile profile, const SpvVersion& spvVersion)
{
    //
    // In this function proper, enumerate the types, then calls the next set of functions
    // to enumerate all the uses for that type.
    //

    // enumerate all the types
    const TBasicType bTypes[] = { EbtFloat, EbtInt, EbtUint,
         EbtFloat16
    };
    bool skipBuffer = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 140);
    bool skipCubeArrayed = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 130);
    for (int image = 0; image <= 1; ++image) // loop over "bool" image vs sampler
    {
        for (int shadow = 0; shadow <= 1; ++shadow) { // loop over "bool" shadow or not
            for (int ms = 0; ms <= 1; ++ms) // loop over "bool" multisample or not
            {
                if ((ms || image) && shadow)
                    continue;
                if (ms && profile != EEsProfile && version < 140)
                    continue;
                if (ms && image && profile == EEsProfile)
                    continue;
                if (ms && profile == EEsProfile && version < 310)
                    continue;

                for (int arrayed = 0; arrayed <= 1; ++arrayed) { // loop over "bool" arrayed or not
                    for (int dim = Esd1D; dim < EsdNumDims; ++dim) { // 1D, ..., buffer, subpass
                        if (dim == EsdAttachmentEXT)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim != Esd2D && dim != EsdSubpass && ms)
                            continue;
                        if (dim == EsdBuffer && skipBuffer)
                            continue;
                        if (dim == EsdBuffer && (shadow || arrayed || ms))
                            continue;
                        if (ms && arrayed && profile == EEsProfile && version < 310)
                            continue;
                        if (dim == Esd3D && shadow)
                            continue;
                        if (dim == EsdCube && arrayed && skipCubeArrayed)
                            continue;
                        if ((dim == Esd3D || dim == EsdRect) && arrayed)
                            continue;

                        // Loop over the bTypes
                        for (size_t bType = 0; bType < sizeof(bTypes)/sizeof(TBasicType); ++bType) {
                            if (bTypes[bType] == EbtFloat16 && (profile == EEsProfile || version < 450))
                                continue;
                            if (dim == EsdRect && version < 140 && bType > 0)
                                continue;
                            if (shadow && (bTypes[bType] == EbtInt || bTypes[bType] == EbtUint))
                                continue;
                            //
                            // Now, make all the function prototypes for the type we just built...
                            //
                            TSampler sampler;
                            if (dim == EsdSubpass) {
                                sampler.setSubpass(bTypes[bType], ms ? true : false);
                            } else if (dim == EsdAttachmentEXT) {
                                sampler.setAttachmentEXT(bTypes[bType]);
                            } else
                            if (image) {
                                sampler.setImage(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                                  shadow  ? true : false,
                                                                                  ms      ? true : false);
                            } else {
                                sampler.set(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                             shadow  ? true : false,
                                                                             ms      ? true : false);
                            }

                            TString typeName = sampler.getString();

                            if (dim == EsdSubpass) {
                                addSubpassSampling(sampler, typeName, version, profile);
                                continue;
                            }

                            addQueryFunctions(sampler, typeName, version, profile);

                            if (image)
                                addImageFunctions(sampler, typeName, version, profile);
                            else {
                                addSamplingFunctions(sampler, typeName, version, profile);
                                addGatherFunctions(sampler, typeName, version, profile);
                                if (spvVersion.vulkan > 0 && sampler.isCombined() && !sampler.shadow) {
                                    // Base Vulkan allows texelFetch() for
                                    // textureBuffer (i.e. without sampler).
                                    //
                                    // GL_EXT_samplerless_texture_functions
                                    // allows texelFetch() and query functions
                                    // (other than textureQueryLod()) for all
                                    // texture types.
                                    sampler.setTexture(sampler.type, sampler.dim, sampler.arrayed, sampler.shadow,
                                                       sampler.ms);
                                    TString textureTypeName = sampler.getString();
                                    addSamplingFunctions(sampler, textureTypeName, version, profile);
                                    addQueryFunctions(sampler, textureTypeName, version, profile);
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    //
    // sparseTexelsResidentARB()
    //
    if (profile != EEsProfile && version >= 450) {
        commonBuiltins.append("bool sparseTexelsResidentARB(int code);\n");
    }
}